

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O1

void EPD_DrawCircle(uint16_t Xpos,uint16_t Ypos,uint16_t Radius,uint8_t color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined6 in_register_00000012;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar4 = CONCAT62(in_register_00000012,Radius);
  iVar1 = (int)uVar4 * -2 + 3;
  iVar2 = 6;
  iVar7 = 0;
  uVar5 = 0;
  do {
    uVar9 = (uint)Xpos;
    uVar6 = uVar9 + uVar5;
    iVar3 = (int)uVar4;
    uVar11 = (uint)Ypos - iVar3;
    if (((ushort)uVar6 < gstI80DevInfo.usPanelW) && ((ushort)uVar11 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf[(uVar6 & 0xffff) + (uint)gstI80DevInfo.usPanelW * (uVar11 & 0xffff)] = color;
    }
    uVar10 = uVar9 + iVar7;
    if (((ushort)uVar10 < gstI80DevInfo.usPanelW) && ((ushort)uVar11 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf[(uVar10 & 0xffff) + (uint)gstI80DevInfo.usPanelW * (uVar11 & 0xffff)] = color;
    }
    uVar12 = iVar3 + uVar9;
    uVar11 = (uint)Ypos + iVar7;
    if (((ushort)uVar12 < gstI80DevInfo.usPanelW) && ((ushort)uVar11 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf[(uVar12 & 0xffff) + (uVar11 & 0xffff) * (uint)gstI80DevInfo.usPanelW] = color;
    }
    uVar9 = uVar9 - iVar3;
    if (((ushort)uVar9 < gstI80DevInfo.usPanelW) && ((ushort)uVar11 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf[(uVar9 & 0xffff) + (uVar11 & 0xffff) * (uint)gstI80DevInfo.usPanelW] = color;
    }
    uVar11 = iVar3 + (uint)Ypos;
    if (((ushort)uVar6 < gstI80DevInfo.usPanelW) && ((ushort)uVar11 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf[(uVar6 & 0xffff) + (uint)gstI80DevInfo.usPanelW * (uVar11 & 0xffff)] = color;
    }
    if (((ushort)uVar10 < gstI80DevInfo.usPanelW) && ((ushort)uVar11 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf[(uVar10 & 0xffff) + (uint)gstI80DevInfo.usPanelW * (uVar11 & 0xffff)] = color;
    }
    uVar6 = Ypos + uVar5;
    if (((ushort)uVar12 < gstI80DevInfo.usPanelW) && ((ushort)uVar6 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf[(uVar12 & 0xffff) + (uVar6 & 0xffff) * (uint)gstI80DevInfo.usPanelW] = color;
    }
    if (((ushort)uVar9 < gstI80DevInfo.usPanelW) && ((ushort)uVar6 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf[(uVar9 & 0xffff) + (uVar6 & 0xffff) * (uint)gstI80DevInfo.usPanelW] = color;
    }
    iVar8 = iVar2;
    if (-1 < iVar1) {
      uVar4 = (ulong)(iVar3 - 1);
      iVar8 = (uVar5 - iVar3) * 4 + 10;
    }
    iVar1 = iVar1 + iVar8;
    uVar5 = uVar5 + 1;
    iVar2 = iVar2 + 4;
    iVar7 = iVar7 + -1;
  } while (uVar5 <= (uint)uVar4);
  return;
}

Assistant:

void EPD_DrawCircle(uint16_t Xpos,uint16_t Ypos,uint16_t Radius,uint8_t color)
{
	  int   decision;    	/* Decision Variable */ 
	  uint32_t  current_x;   	/* Current X Value */
	  uint32_t  current_y;   	/* Current Y Value */
	  
	  decision = 3 - (Radius << 1);
	  current_x = 0;
	  current_y = Radius;
	  
	  while (current_x <= current_y)
	  {
		    EPD_DrawPixel((Xpos + current_x), (Ypos - current_y), color);
		    
		    EPD_DrawPixel((Xpos - current_x), (Ypos - current_y), color);
		    
		    EPD_DrawPixel((Xpos + current_y), (Ypos - current_x), color);
		    
		    EPD_DrawPixel((Xpos - current_y), (Ypos - current_x), color);
		    
		    EPD_DrawPixel((Xpos + current_x), (Ypos + current_y), color);
		    
		    EPD_DrawPixel((Xpos - current_x), (Ypos + current_y), color);
		    
		    EPD_DrawPixel((Xpos + current_y), (Ypos + current_x), color);
		    
		    EPD_DrawPixel((Xpos - current_y), (Ypos + current_x), color);
		    
		    if (decision < 0)
		    { 
				decision += (current_x << 2) + 6;
		    }
		    else
		    {
			      decision += ((current_x - current_y) << 2) + 10;
			      current_y--;
		    }
		    current_x++;
	  } 
}